

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O0

void Timidity::FreeAll(void)

{
  ToneBank *pTVar1;
  int local_c;
  int i;
  
  free_instruments();
  font_freeall();
  for (local_c = 0; local_c < 0x80; local_c = local_c + 1) {
    if ((&tonebank)[local_c] != 0) {
      pTVar1 = (ToneBank *)(&tonebank)[local_c];
      if (pTVar1 != (ToneBank *)0x0) {
        ToneBank::~ToneBank(pTVar1);
        operator_delete(pTVar1,0x408);
      }
      (&tonebank)[local_c] = 0;
    }
    if ((&drumset)[local_c] != 0) {
      pTVar1 = (ToneBank *)(&drumset)[local_c];
      if (pTVar1 != (ToneBank *)0x0) {
        ToneBank::~ToneBank(pTVar1);
        operator_delete(pTVar1,0x408);
      }
      (&drumset)[local_c] = 0;
    }
  }
  return;
}

Assistant:

void FreeAll()
{
	free_instruments();
	font_freeall();
	for (int i = 0; i < MAXBANK; ++i)
	{
		if (tonebank[i] != NULL)
		{
			delete tonebank[i];
			tonebank[i] = NULL;
		}
		if (drumset[i] != NULL)
		{
			delete drumset[i];
			drumset[i] = NULL;
		}
	}
}